

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFanout.c
# Opt level: O1

void Fraig_NodeRemoveFaninFanout(Fraig_Node_t *pFanin,Fraig_Node_t *pFanoutToRemove)

{
  Fraig_Node_t **ppFVar1;
  Fraig_Node_t *pFVar2;
  Fraig_Node_t *pFVar3;
  
  pFVar2 = pFanin->pFanPivot;
  if (pFVar2 == (Fraig_Node_t *)0x0) {
    pFVar3 = (Fraig_Node_t *)0x0;
  }
  else {
    pFVar3 = (&pFVar2->pFanFanin1)
             [(Fraig_Node_t *)((ulong)pFVar2->p1 & 0xfffffffffffffffe) != pFanin];
  }
  ppFVar1 = &pFanin->pFanPivot;
  if (pFVar2 != (Fraig_Node_t *)0x0) {
    while( true ) {
      if (pFVar2 != pFanoutToRemove) {
        *ppFVar1 = pFVar2;
        ppFVar1 = &pFVar2->pFanFanin1 +
                  ((Fraig_Node_t *)((ulong)pFVar2->p1 & 0xfffffffffffffffe) != pFanin);
      }
      if (pFVar3 == (Fraig_Node_t *)0x0) break;
      pFVar2 = pFVar3;
      pFVar3 = (&pFVar3->pFanFanin1)
               [(Fraig_Node_t *)((ulong)pFVar3->p1 & 0xfffffffffffffffe) != pFanin];
    }
  }
  *ppFVar1 = (Fraig_Node_t *)0x0;
  return;
}

Assistant:

void Fraig_NodeRemoveFaninFanout( Fraig_Node_t * pFanin, Fraig_Node_t * pFanoutToRemove )
{
    Fraig_Node_t * pFanout, * pFanout2, ** ppFanList;
    // start the linked list of fanouts
    ppFanList = &pFanin->pFanPivot; 
    // go through the fanouts
    Fraig_NodeForEachFanoutSafe( pFanin, pFanout, pFanout2 )
    {
        // skip the fanout-to-remove
        if ( pFanout == pFanoutToRemove )
            continue;
        // add useful fanouts to the list
        *ppFanList = pFanout;
        ppFanList = Fraig_NodeReadNextFanoutPlace( pFanin, pFanout );
    }
    *ppFanList = NULL;
}